

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O2

void __thiscall
SuiteMessageTests::TestsetStringWithHeaderGroup::RunImpl(TestsetStringWithHeaderGroup *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  string sStack_588;
  TestDetails local_568;
  Message object;
  DataDictionary dataDictionary;
  
  FIX::Message::Message(&object);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_588,"../spec/FIX43.xml",(allocator<char> *)&local_568);
  FIX::DataDictionary::DataDictionary(&dataDictionary,(string *)&sStack_588,false);
  std::__cxx11::string::~string((string *)&sStack_588);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&sStack_588,RunImpl::str,(allocator<char> *)&local_568);
  FIX::Message::setString(&object,&sStack_588,true,&dataDictionary);
  std::__cxx11::string::~string((string *)&sStack_588);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  FIX::Message::toString_abi_cxx11_((int)&sStack_588,(int)&object,8);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_568,*ppTVar2,0xf1);
  UnitTest::CheckEqual<char_const*,std::__cxx11::string>
            (results,&RunImpl::str,&sStack_588,&local_568);
  std::__cxx11::string::~string((string *)&sStack_588);
  FIX::DataDictionary::~DataDictionary(&dataDictionary);
  FIX::Message::~Message(&object);
  return;
}

Assistant:

TEST(setStringWithHeaderGroup)
{
  FIX::Message object;
  DataDictionary dataDictionary( "../spec/FIX43.xml" );
  static const char* str =
    "8=FIX.4.3\0019=152\00135=A\00134=125\00149=BUYSIDE\001"
    "52=20040916-16:19:18.328\00156=SELLSIDE\001"
    "627=2\001628=HOP1\001629=20040916-16:19:18.328\001630=ID1\001"
    "628=HOP2\001629=20040916-16:19:18.328\001630=ID2\001"
    "10=079\001";

  object.setString( str, true, &dataDictionary );
  CHECK_EQUAL( str, object.toString() );
}